

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O2

_Bool linear_vasprintf_rewrite_tail
                (void *parent,char **str,size_t *start,char *fmt,__va_list_tag *args)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  if (str == (char **)0x0) {
    __assert_fail("str != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                  ,0x36d,
                  "_Bool linear_vasprintf_rewrite_tail(void *, char **, size_t *, const char *, struct __va_list_tag *)"
                 );
  }
  if (*str == (char *)0x0) {
    pcVar2 = linear_vasprintf(parent,fmt,args);
    *str = pcVar2;
    sVar3 = strlen(pcVar2);
  }
  else {
    sVar1 = printf_length(fmt,args);
    pcVar2 = (char *)linear_realloc(parent,*str,(int)*start + (int)sVar1 + 1);
    if (pcVar2 == (char *)0x0) {
      return false;
    }
    vsnprintf(pcVar2 + *start,sVar1 + 1,fmt,args);
    *str = pcVar2;
    sVar3 = *start + sVar1;
  }
  *start = sVar3;
  return true;
}

Assistant:

bool
linear_vasprintf_rewrite_tail(void *parent, char **str, size_t *start,
                              const char *fmt, va_list args)
{
   size_t new_length;
   char *ptr;

   assert(str != NULL);

   if (unlikely(*str == NULL)) {
      *str = linear_vasprintf(parent, fmt, args);
      *start = strlen(*str);
      return true;
   }

   new_length = printf_length(fmt, args);

   ptr = linear_realloc(parent, *str, *start + new_length + 1);
   if (unlikely(ptr == NULL))
      return false;

   vsnprintf(ptr + *start, new_length + 1, fmt, args);
   *str = ptr;
   *start += new_length;
   return true;
}